

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

Maybe<capnp::ClientHook_&> __thiscall
capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::getResolved
          (DeferredThirdPartyClient *this)

{
  Tag TVar1;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
  *this_00;
  Deferred *pDVar2;
  Own<capnp::ClientHook,_std::nullptr_t> *this_01;
  ClientHook *pCVar3;
  long in_RSI;
  Own<capnp::ClientHook,_std::nullptr_t> *_kj_switch_done_1;
  Own<capnp::ClientHook,_std::nullptr_t> *cap;
  Deferred *_kj_switch_done;
  Deferred *deferred;
  OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
  *_kj_switch_subject;
  DeferredThirdPartyClient *this_local;
  
  this_00 = kj::
            OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
            ::_switchSubject((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
                              *)(in_RSI + 0x40));
  TVar1 = kj::
          OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
          ::which(this_00);
  if (TVar1 == _variant0) {
    pDVar2 = kj::
             OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,_kj::Own<capnp::ClientHook,_std::nullptr_t>_>
             ::get<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred>
                       (this_00);
    if (pDVar2 != (Deferred *)0x0) {
      kj::Maybe<capnp::ClientHook_&>::Maybe((Maybe<capnp::ClientHook_&> *)this);
      return (Maybe<capnp::ClientHook_&>)(ClientHook *)this;
    }
  }
  else if ((TVar1 == _variant1) &&
          (this_01 = kj::
                     OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                     ::get<kj::Own<capnp::ClientHook,decltype(nullptr)>>
                               ((OneOf<capnp::_::RpcSystemBase::RpcConnectionState::DeferredThirdPartyClient::Deferred,kj::Own<capnp::ClientHook,decltype(nullptr)>>
                                 *)this_00),
          this_01 != (Own<capnp::ClientHook,_std::nullptr_t> *)0x0)) {
    pCVar3 = kj::Own<capnp::ClientHook,_std::nullptr_t>::operator->(this_01);
    (*pCVar3->_vptr_ClientHook[2])(this);
    return (Maybe<capnp::ClientHook_&>)(ClientHook *)this;
  }
  kj::_::unreachable();
}

Assistant:

kj::Maybe<ClientHook&> getResolved() override {
      // This is tricky: Although whenMoreResolved() triggers accept, getResolved() shouldn't,
      // because lots of stuff calls getResolved() optimistically and it doesn't necessarily mean
      // the caller wants to use the capability.
      KJ_SWITCH_ONEOF(state) {
        KJ_CASE_ONEOF(deferred, Deferred) {
          return kj::none;
        }
        KJ_CASE_ONEOF(cap, kj::Own<ClientHook>) {
          return cap->getResolved();
        }
      }
      KJ_UNREACHABLE;
    }